

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

uint __thiscall llvm::ARM::parseHWDiv(ARM *this,StringRef HWDiv)

{
  bool bVar1;
  StringRef SVar2;
  StringRef SVar3;
  char *local_f8;
  char *local_f0;
  undefined1 local_d8 [8];
  anon_struct_24_3_018e140a D;
  anon_struct_24_3_018e140a *__end1;
  anon_struct_24_3_018e140a *__begin1;
  anon_struct_24_3_018e140a (*__range1) [5];
  char *local_98;
  StringRef Syn;
  StringRef HWDiv_local;
  char *local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  SVar2.Length = (size_t)HWDiv.Data;
  SVar2.Data = (char *)this;
  SVar2 = getHWDivSynonym(SVar2);
  __end1 = (anon_struct_24_3_018e140a *)&(anonymous_namespace)::HWDivNames;
  D._16_8_ = &DAT_002e32a8;
  while( true ) {
    if (__end1 == (anon_struct_24_3_018e140a *)D._16_8_) {
      return 0;
    }
    local_d8 = (undefined1  [8])__end1->NameCStr;
    D.NameCStr = (char *)__end1->NameLength;
    D.NameLength = *(size_t *)&__end1->ID;
    local_98 = SVar2.Data;
    Syn.Data = (char *)SVar2.Length;
    SVar3 = anon_unknown.dwarf_1c31ec::anon_struct_24_3_018e140a::getName
                      ((anon_struct_24_3_018e140a *)local_d8);
    local_f8 = SVar3.Data;
    local_f0 = (char *)SVar3.Length;
    local_50 = local_98;
    local_48 = Syn.Data;
    local_38 = local_f8;
    local_30 = local_f0;
    local_40 = &local_50;
    bVar1 = false;
    if (Syn.Data == local_f0) {
      local_18 = local_98;
      local_20 = local_f8;
      local_28 = local_f0;
      if (local_f0 == (char *)0x0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(local_98,local_f8,(size_t)local_f0);
      }
      bVar1 = local_c == 0;
    }
    if (bVar1) break;
    __end1 = __end1 + 1;
  }
  return (uint)D.NameLength;
}

Assistant:

unsigned llvm::ARM::parseHWDiv(StringRef HWDiv) {
  StringRef Syn = getHWDivSynonym(HWDiv);
  for (const auto D : HWDivNames) {
    if (Syn == D.getName())
      return D.ID;
  }
  return ARM::AEK_INVALID;
}